

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentHandler::CopyDirectObjectToIndirectObject
          (PDFDocumentHandler *this,PDFObject *inObject,ObjectIDType inTargetObjectID)

{
  EStatusCode EVar1;
  EPDFObjectType EVar2;
  OutWritingPolicy writingPolicy;
  ObjectIDTypeList newObjectsToWrite;
  
  writingPolicy.mSourceObjectsToAdd = &newObjectsToWrite;
  newObjectsToWrite.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size = 0;
  writingPolicy.super_IObjectWritePolicy._vptr_IObjectWritePolicy =
       (_func_int **)&PTR_WriteReference_003700f0;
  writingPolicy.mDocumentHandler = this;
  newObjectsToWrite.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)writingPolicy.mSourceObjectsToAdd;
  newObjectsToWrite.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)writingPolicy.mSourceObjectsToAdd;
  EVar1 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inTargetObjectID);
  if (EVar1 == eSuccess) {
    EVar1 = WriteObjectByType(this,inObject,eTokenSeparatorEndLine,
                              &writingPolicy.super_IObjectWritePolicy);
    if (EVar1 == eSuccess) {
      EVar2 = PDFObject::GetType(inObject);
      if (EVar2 != ePDFObjectStream) {
        ObjectsContext::EndIndirectObject(this->mObjectsContext);
      }
      EVar1 = WriteNewObjects(this,&newObjectsToWrite);
    }
  }
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
            (&newObjectsToWrite.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return EVar1;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyDirectObjectToIndirectObject(PDFObject* inObject,ObjectIDType inTargetObjectID)
{
	EStatusCode status;
	ObjectIDTypeList newObjectsToWrite;
	OutWritingPolicy writingPolicy(this, newObjectsToWrite);

	status = mObjectsContext->StartNewIndirectObject(inTargetObjectID);
	if(status != PDFHummus::eSuccess)
		return status;
	status = WriteObjectByType(inObject,eTokenSeparatorEndLine, &writingPolicy);
	if(PDFHummus::eSuccess == status)
	{
		if(inObject->GetType() != PDFObject::ePDFObjectStream) // write indirect object end for non streams only...cause they take care of writing their own
			mObjectsContext->EndIndirectObject();
		return WriteNewObjects(newObjectsToWrite);
	}
	else
		return status;
}